

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O2

void __thiscall gerr::details::MessageError::~MessageError(MessageError *this)

{
  ~MessageError(this);
  operator_delete(this);
  return;
}

Assistant:

int Code() const override { return 0; }